

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void VL4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 auVar4 [16];
  undefined1 auVar11 [16];
  undefined1 uVar12;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar13;
  undefined1 auVar14 [16];
  
  uVar1 = *(ulong *)(dst + -0x20);
  auVar4._0_8_ = uVar1 >> 8;
  auVar4._8_8_ = 0;
  auVar11._8_4_ = (int)uVar1;
  auVar11._0_8_ = uVar1;
  auVar11._12_4_ = (int)(uVar1 >> 0x20);
  uVar3 = (undefined1)(uVar1 >> 8);
  uVar12 = pavgb((char)uVar1,uVar3);
  uVar5 = (undefined1)(uVar1 >> 0x10);
  uVar15 = pavgb(uVar3,uVar5);
  uVar6 = (undefined1)(uVar1 >> 0x18);
  uVar16 = pavgb(uVar5,uVar6);
  uVar7 = (undefined1)(uVar1 >> 0x20);
  uVar17 = pavgb(uVar6,uVar7);
  uVar13 = CONCAT13(uVar17,CONCAT12(uVar16,CONCAT11(uVar15,uVar12)));
  uVar8 = (undefined1)(uVar1 >> 0x28);
  uVar18 = pavgb(uVar7,uVar8);
  auVar14._0_5_ = CONCAT14(uVar18,uVar13);
  uVar9 = (undefined1)(uVar1 >> 0x30);
  auVar14[5] = pavgb(uVar8,uVar9);
  uVar10 = (undefined1)(uVar1 >> 0x38);
  auVar14[6] = pavgb(uVar9,uVar10);
  auVar14[7] = pavgb(uVar10,0);
  auVar14[8] = pavgb(0,0);
  auVar14[9] = pavgb(0,0);
  auVar14[10] = pavgb(0,0);
  auVar14[0xb] = pavgb(0,0);
  auVar14[0xc] = pavgb(0,0);
  auVar14[0xd] = pavgb(0,0);
  auVar14[0xe] = pavgb(0,0);
  auVar14[0xf] = pavgb(0,0);
  auVar19[0] = pavgb(uVar5,uVar3);
  auVar19[1] = pavgb(uVar6,uVar5);
  auVar19[2] = pavgb(uVar7,uVar6);
  auVar19[3] = pavgb(uVar8,uVar7);
  auVar19[4] = pavgb(uVar9,uVar8);
  auVar19[5] = pavgb(uVar10,uVar9);
  auVar19[6] = pavgb(0,uVar10);
  auVar19[7] = pavgb(0,0);
  auVar19[8] = pavgb(0,0);
  auVar19[9] = pavgb(0,0);
  auVar19[10] = pavgb(0,0);
  auVar19[0xb] = pavgb(0,0);
  auVar19[0xc] = pavgb(0,0);
  auVar19[0xd] = pavgb(0,0);
  auVar19[0xe] = pavgb(0,0);
  auVar19[0xf] = pavgb(0,0);
  auVar20[0] = pavgb(uVar12,auVar19[0]);
  auVar20[1] = pavgb(uVar15,auVar19[1]);
  auVar20[2] = pavgb(uVar16,auVar19[2]);
  auVar20[3] = pavgb(uVar17,auVar19[3]);
  auVar20[4] = pavgb(uVar18,auVar19[4]);
  auVar20[5] = pavgb(auVar14[5],auVar19[5]);
  auVar20[6] = pavgb(auVar14[6],auVar19[6]);
  auVar20[7] = pavgb(auVar14[7],auVar19[7]);
  auVar20[8] = pavgb(auVar14[8],auVar19[8]);
  auVar20[9] = pavgb(auVar14[9],auVar19[9]);
  auVar20[10] = pavgb(auVar14[10],auVar19[10]);
  auVar20[0xb] = pavgb(auVar14[0xb],auVar19[0xb]);
  auVar20[0xc] = pavgb(auVar14[0xc],auVar19[0xc]);
  auVar20[0xd] = pavgb(auVar14[0xd],auVar19[0xd]);
  auVar20[0xe] = pavgb(auVar14[0xe],auVar19[0xe]);
  auVar20[0xf] = pavgb(auVar14[0xf],auVar19[0xf]);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1 ^ auVar4._0_8_;
  auVar2 = psubusb(auVar20,(auVar11 >> 0x50 ^ auVar4 | auVar2) & (auVar19 ^ auVar14) & _DAT_0012dbf0
                  );
  *(undefined4 *)dst = uVar13;
  *(int *)(dst + 0x20) = auVar2._0_4_;
  *(int *)(dst + 0x40) = (int)((uint5)auVar14._0_5_ >> 8);
  *(int *)(dst + 0x60) = auVar2._1_4_;
  dst[0x43] = auVar2[4];
  dst[99] = auVar2[5];
  return;
}

Assistant:

static void VL4_SSE2(uint8_t* dst) {   // Vertical-Left
  const __m128i one = _mm_set1_epi8(1);
  const __m128i ABCDEFGH = _mm_loadl_epi64((__m128i*)(dst - BPS));
  const __m128i BCDEFGH_ = _mm_srli_si128(ABCDEFGH, 1);
  const __m128i CDEFGH__ = _mm_srli_si128(ABCDEFGH, 2);
  const __m128i avg1 = _mm_avg_epu8(ABCDEFGH, BCDEFGH_);
  const __m128i avg2 = _mm_avg_epu8(CDEFGH__, BCDEFGH_);
  const __m128i avg3 = _mm_avg_epu8(avg1, avg2);
  const __m128i lsb1 = _mm_and_si128(_mm_xor_si128(avg1, avg2), one);
  const __m128i ab = _mm_xor_si128(ABCDEFGH, BCDEFGH_);
  const __m128i bc = _mm_xor_si128(CDEFGH__, BCDEFGH_);
  const __m128i abbc = _mm_or_si128(ab, bc);
  const __m128i lsb2 = _mm_and_si128(abbc, lsb1);
  const __m128i avg4 = _mm_subs_epu8(avg3, lsb2);
  const uint32_t extra_out =
      (uint32_t)_mm_cvtsi128_si32(_mm_srli_si128(avg4, 4));
  WebPInt32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               avg1    ));
  WebPInt32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(               avg4    ));
  WebPInt32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(avg1, 1)));
  WebPInt32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_srli_si128(avg4, 1)));

  // these two are hard to get and irregular
  DST(3, 2) = (extra_out >> 0) & 0xff;
  DST(3, 3) = (extra_out >> 8) & 0xff;
}